

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffsparser.cpp
# Opt level: O1

USTATUS __thiscall
FfsParser::parseSections
          (FfsParser *this,UByteArray *sections,UModelIndex *index,bool insertIntoTree)

{
  uint uVar1;
  TreeModel *this_00;
  uint uVar2;
  bool bVar3;
  UINT8 UVar4;
  UINT32 len;
  int iVar5;
  int iVar6;
  USTATUS UVar7;
  _Alloc_hider this_01;
  UINT32 sectionOffset;
  UByteArray data;
  UModelIndex sectionIndex;
  CBString info;
  UModelIndex parentVolumeIndex;
  undefined1 local_98 [16];
  undefined1 local_88 [64];
  UModelIndex dataIndex;
  
  if (index->r < 0) {
    return 1;
  }
  if (index->c < 0) {
    return 1;
  }
  if (index->m == (TreeModel *)0x0) {
    return 1;
  }
  uVar1 = (uint)(sections->d)._M_string_length;
  TreeModel::header(&data,this->model,index);
  uVar2 = (uint)data.d._M_string_length;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)data.d._M_dataplus._M_p != &data.d.field_2) {
    operator_delete(data.d._M_dataplus._M_p);
  }
  this_01._M_p = (pointer)&parentVolumeIndex;
  TreeModel::findParentOfType((UModelIndex *)this_01._M_p,this->model,index,'A');
  UVar4 = '\x02';
  if (((-1 < parentVolumeIndex.r) && (-1 < parentVolumeIndex.c)) &&
     (parentVolumeIndex.m != (TreeModel *)0x0)) {
    this_01._M_p = (pointer)this->model;
    bVar3 = TreeModel::hasEmptyParsingData((TreeModel *)this_01._M_p,&parentVolumeIndex);
    if (!bVar3) {
      TreeModel::parsingData(&data,this->model,&parentVolumeIndex);
      UVar4 = data.d._M_dataplus._M_p[0x19];
      this_01 = data.d._M_dataplus;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)data.d._M_dataplus._M_p != &data.d.field_2) {
        operator_delete(data.d._M_dataplus._M_p);
      }
    }
  }
  sectionOffset = 0;
  while (sectionOffset < uVar1) {
    len = getSectionSize((FfsParser *)this_01._M_p,sections,sectionOffset,UVar4);
    if ((len < 4) || (uVar1 - sectionOffset < len)) {
      if (!insertIntoTree) {
        return 0x14;
      }
      UByteArray::mid(&data,sections,sectionOffset,-1);
      usprintf(&info,"Full size: %Xh (%u)",(ulong)(uint)data.d._M_string_length);
      this_00 = this->model;
      Bstrlib::CBString::CBString((CBString *)(local_88 + 0x10),"Non-UEFI data");
      Bstrlib::CBString::CBString((CBString *)(local_88 + 0x28));
      sectionIndex.i = 0;
      sectionIndex.m = (TreeModel *)((ulong)sectionIndex.m & 0xffffffffffffff00);
      local_98._8_8_ = (FitParser *)0x0;
      local_88[0] = '\0';
      sectionIndex._0_8_ = &sectionIndex.m;
      local_98._0_8_ = (pointer)local_88;
      TreeModel::addItem(&dataIndex,this_00,sectionOffset + uVar2,'@','z',
                         (CBString *)(local_88 + 0x10),(CBString *)(local_88 + 0x28),&info,
                         (UByteArray *)&sectionIndex,&data,(UByteArray *)local_98,Fixed,index,'\0');
      if ((pointer)local_98._0_8_ != (pointer)local_88) {
        operator_delete((void *)local_98._0_8_);
      }
      if ((TreeModel **)sectionIndex._0_8_ != &sectionIndex.m) {
        operator_delete((void *)sectionIndex._0_8_);
      }
      Bstrlib::CBString::~CBString((CBString *)(local_88 + 0x28));
      Bstrlib::CBString::~CBString((CBString *)(local_88 + 0x10));
      usprintf((CBString *)&sectionIndex,"%s: non-UEFI data found in sections area","parseSections")
      ;
      msg(this,(CBString *)&sectionIndex,&dataIndex);
      Bstrlib::CBString::~CBString((CBString *)&sectionIndex);
      Bstrlib::CBString::~CBString(&info);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)data.d._M_dataplus._M_p != &data.d.field_2) {
        operator_delete(data.d._M_dataplus._M_p);
      }
      break;
    }
    sectionIndex.r = -1;
    sectionIndex.c = -1;
    sectionIndex.i = 0;
    sectionIndex.m = (TreeModel *)0x0;
    UByteArray::mid(&data,sections,sectionOffset,len);
    UVar7 = parseSectionHeader(this,&data,uVar2 + sectionOffset,index,&sectionIndex,insertIntoTree);
    this_01 = data.d._M_dataplus;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)data.d._M_dataplus._M_p != &data.d.field_2) {
      operator_delete(data.d._M_dataplus._M_p);
    }
    if (UVar7 == 0) {
LAB_00131207:
      sectionOffset = sectionOffset + len + 3 & 0xfffffffc;
      bVar3 = true;
    }
    else {
      if (insertIntoTree) {
        this_01._M_p = local_98;
        usprintf((CBString *)this_01._M_p,"%s: section header parsing failed with error ",
                 "parseSections");
        errorCodeToUString(&info,UVar7);
        Bstrlib::CBString::operator+((CBString *)&data,(CBString *)this_01._M_p,&info);
        msg(this,(CBString *)&data,index);
        Bstrlib::CBString::~CBString((CBString *)&data);
        Bstrlib::CBString::~CBString(&info);
        Bstrlib::CBString::~CBString((CBString *)this_01._M_p);
        goto LAB_00131207;
      }
      bVar3 = false;
    }
    if (!bVar3) {
      return 0x14;
    }
  }
  iVar5 = TreeModel::rowCount(this->model,index);
  if (0 < iVar5) {
    UVar7 = 0x14;
    iVar5 = 0;
    do {
      bVar3 = false;
      TreeModel::index((TreeModel *)&data,(char *)index->m,iVar5);
      UVar4 = TreeModel::type(this->model,(UModelIndex *)&data);
      if (UVar4 == '@') {
LAB_00131416:
        bVar3 = true;
      }
      else {
        if (UVar4 == 'C') {
          parseSectionBody(this,(UModelIndex *)&data);
          goto LAB_00131416;
        }
        UVar7 = 9;
      }
      if (!bVar3) {
        return UVar7;
      }
      iVar5 = iVar5 + 1;
      iVar6 = TreeModel::rowCount(this->model,index);
    } while (iVar5 < iVar6);
  }
  return 0;
}

Assistant:

USTATUS FfsParser::parseSections(const UByteArray & sections, const UModelIndex & index, const bool insertIntoTree)
{
    // Sanity check
    if (!index.isValid())
        return U_INVALID_PARAMETER;
    
    // Search for and parse all sections
    UINT32 bodySize = (UINT32)sections.size();
    UINT32 headerSize = (UINT32)model->header(index).size();
    UINT32 sectionOffset = 0;
    USTATUS result = U_SUCCESS;
    
    // Obtain required information from parent volume
    UINT8 ffsVersion = 2;
    UModelIndex parentVolumeIndex = model->findParentOfType(index, Types::Volume);
    if (parentVolumeIndex.isValid() && model->hasEmptyParsingData(parentVolumeIndex) == false) {
        UByteArray data = model->parsingData(parentVolumeIndex);
        const VOLUME_PARSING_DATA* pdata = (const VOLUME_PARSING_DATA*)data.constData();
        ffsVersion = pdata->ffsVersion;
    }
    
    // Iterate over sections
    UINT32 sectionSize = 0;
    while (sectionOffset < bodySize) {
        // Get section size
        sectionSize = getSectionSize(sections, sectionOffset, ffsVersion);
        
        // Check section size to be sane
        if (sectionSize < sizeof(EFI_COMMON_SECTION_HEADER)
            || sectionSize > (bodySize - sectionOffset)) {
            // Final parsing
            if (insertIntoTree) {
                // Add padding to fill the rest of sections
                UByteArray padding = sections.mid(sectionOffset);
                
                // Get info
                UString info = usprintf("Full size: %Xh (%u)", (UINT32)padding.size(), (UINT32)padding.size());
                
                // Add tree item
                UModelIndex dataIndex = model->addItem(headerSize + sectionOffset, Types::Padding, Subtypes::DataPadding, UString("Non-UEFI data"), UString(), info, UByteArray(), padding, UByteArray(), Fixed, index);
                
                // Show message
                msg(usprintf("%s: non-UEFI data found in sections area", __FUNCTION__), dataIndex);
                
                // Exit from parsing loop
                break;
            }
            // Preliminary parsing
            else {
                return U_INVALID_SECTION;
            }
        }
        
        // Parse section header
        UModelIndex sectionIndex;
        result = parseSectionHeader(sections.mid(sectionOffset, sectionSize), headerSize + sectionOffset, index, sectionIndex, insertIntoTree);
        if (result) {
            if (insertIntoTree)
                msg(usprintf("%s: section header parsing failed with error ", __FUNCTION__) + errorCodeToUString(result), index);
            else
                return U_INVALID_SECTION;
        }
        
        // Move to next section
        sectionOffset += sectionSize;
        // TODO: verify that alignment bytes are actually zero as per PI spec
        sectionOffset = ALIGN4(sectionOffset);
    }
    
#if 0 // Do not enable this in production for now, as it needs further investigation.
    // The PI spec requires sections to be aligned by 4 byte boundary with bytes that are all exactly zeroes
    // Some images interpret "must be aligned by 4" as "every section needs to be padded for sectionSize to be divisible by 4".
    // Detecting this case can be done by checking for the very last section to have sectionSize not divisible by 4, while the total bodySize is.
    // However, such detection for a single file is unreliable because in 1/4 random cases the last section will be divisible by 4.
    // We also know that either PEI core or DXE core is entity that does file and section parsing,
    // so every single file in the volume should behave consistently.
    // This makes the probability of unsuccessful detection here to be 1/(4^numFilesInVolume),
    // which is low enough for real images out there.
    // It should also be noted that enabling this section alignment quirk for an image that doesn't require it
    // will not make the image unbootable, but will waste some space and possibly require to move some files around
    if (sectionOffset == bodySize) {
        // We are now at the very end of the file body, and sectionSize is the size of the last section
        if ((sectionSize % 4 != 0) // sectionSize of the very last section is not divisible by 4
            && (bodySize % 4 == 0)) { // yet bodySize is, meaning that there are indeed some padding bytes added after the last section
            msg(usprintf("%s: section alignment quirk found", __FUNCTION__), index);
        }
    }
#endif
    
    // Parse bodies, will be skipped if insertIntoTree is not required
    for (int i = 0; i < model->rowCount(index); i++) {
        UModelIndex current = index.model()->index(i, 0, index);
        
        switch (model->type(current)) {
            case Types::Section:
                parseSectionBody(current);
                break;
            case Types::Padding:
                // No parsing required
                break;
            default:
                return U_UNKNOWN_ITEM_TYPE;
        }
    }
    
    return U_SUCCESS;
}